

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O2

int arkStep_GetNonlinSolvStats(ARKodeMem ark_mem,long *nniters,long *nnfails)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  ARKodeARKStepMem step_mem;
  ARKodeARKStepMem local_18;
  
  local_18 = (ARKodeARKStepMem)CONCAT44(in_register_00000004,in_EAX);
  iVar1 = arkStep_AccessStepMem(ark_mem,"arkStep_GetNonlinSolvStats",&local_18);
  if (iVar1 == 0) {
    *nniters = local_18->nls_iters;
    *nnfails = local_18->nls_fails;
  }
  return iVar1;
}

Assistant:

int arkStep_GetNonlinSolvStats(ARKodeMem ark_mem, long int* nniters,
                               long int* nnfails)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  *nniters = step_mem->nls_iters;
  *nnfails = step_mem->nls_fails;

  return (ARK_SUCCESS);
}